

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WabtInterface.cpp
# Opt level: O2

Var Js::WabtInterface::EntryConvertWast2Wasm(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  charcount_t cchSource;
  undefined4 *puVar4;
  Var pvVar5;
  DynamicObject *instance;
  undefined7 extraout_var;
  char16 *source;
  uchar *dest;
  RecyclableObject *pRVar6;
  JavascriptString *count;
  int in_stack_00000010;
  SpecContext spec;
  ArenaAllocator arena;
  Context context;
  CallInfo callInfo_local;
  JavascriptString *string;
  undefined1 local_48 [8];
  ArgumentReader args;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  context.scriptContext = (ScriptContext *)callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WabtInterface.cpp"
                                ,0x6d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00c207d9;
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_48,(CallInfo *)&context.scriptContext,(Var *)&stack0x00000018);
  if ((local_48._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WabtInterface.cpp"
                                ,0x6e,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar2) goto LAB_00c207d9;
    *puVar4 = 0;
  }
  if (((ulong)context.scriptContext & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WabtInterface.cpp"
                                ,0x70,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) goto LAB_00c207d9;
    *puVar4 = 0;
  }
  if ((local_48._0_4_ & 0xfffffe) == 0) {
LAB_00c207ca:
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e4a6,(PCWSTR)0x0);
  }
  pvVar5 = Arguments::operator[]((Arguments *)local_48,1);
  bVar2 = VarIs<Js::JavascriptString>(pvVar5);
  if (!bVar2) goto LAB_00c207ca;
  if ((local_48._0_4_ & 0xffffff) < 3) {
    args.super_Arguments.Values._4_4_ = 0;
  }
  else {
    pvVar5 = Arguments::operator[]((Arguments *)local_48,2);
    BVar3 = JavascriptOperators::IsObject(pvVar5);
    if (BVar3 == 0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec71,L"config");
    }
    pvVar5 = Arguments::operator[]((Arguments *)local_48,2);
    instance = VarTo<Js::DynamicObject>(pvVar5);
    pvVar5 = JavascriptOperators::OP_GetProperty(instance,0xf4,scriptContext);
    bVar2 = JavascriptConversion::ToBool(pvVar5,scriptContext);
    args.super_Arguments.Values._4_4_ = (undefined4)CONCAT71(extraout_var,bVar2);
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)&spec.push,
             L"Wast2Wasm",&(scriptContext->threadContext->pageAllocator).super_PageAllocator,
             Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
  EnterPinnedScope((void **)&callInfo_local);
  callInfo_local = (CallInfo)Arguments::operator[]((Arguments *)local_48,1);
  source = JavascriptString::GetString((JavascriptString *)callInfo_local);
  context.allocator = (ArenaAllocator *)scriptContext;
  cchSource = JavascriptString::GetLength((JavascriptString *)callInfo_local);
  if (cchSource != 0xffffffff) {
    count = (JavascriptString *)((ulong)cchSource * 3 + 1);
    dest = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_char,false>
                     ((Memory *)&spec.push,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                      (size_t)count);
    if (dest != (uchar *)0x0) {
      string = (JavascriptString *)
               utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)1>
                         (dest,(size_t)count,source,cchSource);
      if (count < string) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                                    ,0x33,"(cbEncoded <= cbDestString)","cbEncoded <= cbDestString")
        ;
        if (!bVar2) {
LAB_00c207d9:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      goto LAB_00c206d1;
    }
  }
  dest = (uchar *)0x0;
LAB_00c206d1:
  LeavePinnedScope();
  arena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
       CreateBuffer;
  Wasm::Threads::IsEnabled();
  Wasm::Simd::IsEnabled();
  Wasm::WasmNontrapping::IsEnabled();
  if (SUB41(args.super_Arguments.Values._4_4_,0) != false) {
    spec.setProperty = Int32ToVar;
    spec.int32ToVar = Int64ToVar;
    spec.int64ToVar = StringToVar;
    spec.stringToVar = CreateObject;
    spec.createObject = CreateArray;
    spec.createArray = Js::Push;
  }
  pRVar6 = (RecyclableObject *)
           ChakraWabt::ConvertWast2Wasm
                     ((ChakraContext *)
                      &arena.
                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                       freeList,(char *)dest,(uint)string,SUB41(args.super_Arguments.Values._4_4_,0)
                     );
  if (pRVar6 == (RecyclableObject *)0x0) {
    pRVar6 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)&spec.push);
  return pRVar6;
}

Assistant:

Js::Var WabtInterface::EntryConvertWast2Wasm(RecyclableObject* function, CallInfo callInfo, ...)
{
    ScriptContext* scriptContext = function->GetScriptContext();
    PROBE_STACK(function->GetScriptContext(), Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count < 2 || !VarIs<JavascriptString>(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedBufferSource);
    }
    bool isSpecText = false;
    if (args.Info.Count > 2)
    {
        // optional config object
        if (!JavascriptOperators::IsObject(args[2]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject, _u("config"));
        }
        DynamicObject * configObject = VarTo<DynamicObject>(args[2]);

        Js::Var isSpecVar = JavascriptOperators::OP_GetProperty(configObject, PropertyIds::spec, scriptContext);
        isSpecText = JavascriptConversion::ToBool(isSpecVar, scriptContext);
    }

    ArenaAllocator arena(_u("Wast2Wasm"), scriptContext->GetThreadContext()->GetPageAllocator(), Throw::OutOfMemory);
    Context context;
    size_t wastSize;
    char* wastBuffer = nullptr;

    ENTER_PINNED_SCOPE(JavascriptString, string);
    string = (JavascriptString*)args[1];
    const char16* str = string->GetString();
    context.allocator = &arena;
    context.scriptContext = scriptContext;

    size_t origSize = string->GetLength();
    auto allocator = [&arena](size_t size) {return (utf8char_t*)AnewArray(&arena, byte, size);};
    utf8::WideStringToNarrow(allocator, str, origSize, &wastBuffer, &wastSize);
    LEAVE_PINNED_SCOPE();   //  string

    try
    {
        ChakraWabt::SpecContext spec;
        ChakraWabt::ChakraContext wabtCtx;
        wabtCtx.user_data = &context;
        wabtCtx.createBuffer = CreateBuffer;
        wabtCtx.features.sign_extends = CONFIG_FLAG(WasmSignExtends);
        wabtCtx.features.threads = Wasm::Threads::IsEnabled();
        wabtCtx.features.simd = Wasm::Simd::IsEnabled();
        wabtCtx.features.sat_float_to_int = Wasm::WasmNontrapping::IsEnabled();
        if (isSpecText)
        {
            wabtCtx.spec = &spec;
            spec.setProperty = SetProperty;
            spec.int32ToVar = Int32ToVar;
            spec.int64ToVar = Int64ToVar;
            spec.stringToVar = StringToVar;
            spec.createObject = CreateObject;
            spec.createArray = CreateArray;
            spec.push = Push;
        }
        void* result = ChakraWabt::ConvertWast2Wasm(wabtCtx, wastBuffer, (uint)wastSize, isSpecText);
        if (result == nullptr)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
        return result;
    }
    catch (ChakraWabt::WabtAPIError& e)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, WABTERR_WabtError, NarrowStringToWide(&context, e.message));
    }
}